

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.h
# Opt level: O3

void __thiscall
obs::observers<Observer>::notify_observers<int,int>
          (observers<Observer> *this,offset_in_observer_type_to_subr method,int args,int args_1)

{
  bool bVar1;
  code *pcVar2;
  undefined4 in_register_00000014;
  long *plVar3;
  undefined4 in_R8D;
  iterator __begin0;
  iterator __end0;
  iterator local_80;
  iterator local_58;
  
  safe_list<Observer>::begin(&local_80,&this->m_observers);
  safe_list<Observer>::end(&local_58,&this->m_observers);
  while( true ) {
    bVar1 = safe_list<Observer>::iterator::operator!=(&local_80,&local_58);
    if (!bVar1) {
      safe_list<Observer>::iterator::~iterator(&local_58);
      safe_list<Observer>::iterator::~iterator(&local_80);
      return;
    }
    if ((local_80.m_node == (node *)0x0) || (local_80.m_locked == false)) break;
    if (local_80.m_value != (Observer *)0x0) {
      plVar3 = (long *)((long)&(local_80.m_value)->_vptr_Observer +
                       CONCAT44(in_register_00000014,args));
      pcVar2 = (code *)method;
      if ((method & 1) != 0) {
        pcVar2 = *(code **)(*plVar3 + -1 + method);
      }
      (*pcVar2)(plVar3,args_1,in_R8D);
    }
    safe_list<Observer>::iterator::operator++(&local_80);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,"T *obs::safe_list<Observer>::iterator::operator*() const [T = Observer]");
}

Assistant:

void notify_observers(void (observer_type::*method)(Args...), Args ...args) {
    for (auto observer : m_observers) {
      if (observer)
        (observer->*method)(std::forward<Args>(args)...);
    }
  }